

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchronization.cc
# Opt level: O0

void __thiscall
tchecker::system::synchronization_t::synchronization_t
          (synchronization_t *this,sync_id_t id,
          vector<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>
          *v,attributes_t *attributes)

{
  bool bVar1;
  invalid_argument *this_00;
  reference constr;
  sync_constraint_t *c;
  const_iterator __end2;
  const_iterator __begin2;
  vector<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>
  *__range2;
  attributes_t *attributes_local;
  vector<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>
  *v_local;
  sync_id_t id_local;
  synchronization_t *this_local;
  
  this->_id = id;
  std::
  vector<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>
  ::vector(&this->_constraints);
  attributes_t::attributes_t(&this->_attributes,attributes);
  bVar1 = valid_sync_id(id);
  if (!bVar1) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (this_00,"synchronization::synchronization_t: invalid synchronization identifier");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  __end2 = std::
           vector<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>
           ::begin(v);
  c = (sync_constraint_t *)
      std::
      vector<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>
      ::end(v);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_tchecker::system::sync_constraint_t_*,_std::vector<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>_>
                                *)&c);
    if (!bVar1) break;
    constr = __gnu_cxx::
             __normal_iterator<const_tchecker::system::sync_constraint_t_*,_std::vector<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>_>
             ::operator*(&__end2);
    add_synchronization_constraint(this,constr);
    __gnu_cxx::
    __normal_iterator<const_tchecker::system::sync_constraint_t_*,_std::vector<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

synchronization_t::synchronization_t(tchecker::sync_id_t id, std::vector<tchecker::system::sync_constraint_t> const & v,
                                     tchecker::system::attributes_t const & attributes)
    : _id(id), _attributes(attributes)
{
  if (!tchecker::valid_sync_id(id))
    throw std::invalid_argument("synchronization::synchronization_t: invalid synchronization identifier");

  for (tchecker::system::sync_constraint_t const & c : v)
    add_synchronization_constraint(c);
}